

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_primitives.cpp
# Opt level: O2

spv_result_t spvtools::val::PrimitivesPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  bool bVar2;
  uint32_t id_00;
  Op opcode;
  int32_t iVar3;
  Function *this;
  char *pcVar4;
  Op opcode_00;
  spv_result_t sVar5;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  opcode_00 = (Op)uVar1;
  if (uVar1 - 0xda < 4) {
    this = ValidationState_t::function(_,inst->function_->id_);
    pcVar4 = spvOpcodeString(opcode_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar4,&local_229);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                   &local_228," instructions require Geometry execution model");
    Function::RegisterExecutionModelLimitation(this,ExecutionModelGeometry,(string *)&local_208);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  sVar5 = SPV_SUCCESS;
  if ((opcode_00 & ~OpUndef) == OpEmitStreamVertex) {
    id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    id_00 = ValidationState_t::GetTypeId(_,id);
    bVar2 = ValidationState_t::IsIntScalarType(_,id_00);
    if (bVar2) {
      opcode = ValidationState_t::GetIdOpcode(_,id);
      iVar3 = spvOpcodeIsConstant(opcode);
      if (iVar3 != 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = spvOpcodeString(opcode_00);
      std::operator<<((ostream *)&local_208,pcVar4);
      pcVar4 = ": expected Stream to be constant instruction";
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = spvOpcodeString(opcode_00);
      std::operator<<((ostream *)&local_208,pcVar4);
      pcVar4 = ": expected Stream to be int scalar";
    }
    std::operator<<((ostream *)&local_208,pcVar4);
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar5 = local_208.error_;
  }
  return sVar5;
}

Assistant:

spv_result_t PrimitivesPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (opcode) {
    case spv::Op::OpEmitVertex:
    case spv::Op::OpEndPrimitive:
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Geometry,
              std::string(spvOpcodeString(opcode)) +
                  " instructions require Geometry execution model");
      break;
    default:
      break;
  }

  switch (opcode) {
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive: {
      const uint32_t stream_id = inst->word(1);
      const uint32_t stream_type = _.GetTypeId(stream_id);
      if (!_.IsIntScalarType(stream_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be int scalar";
      }

      const spv::Op stream_opcode = _.GetIdOpcode(stream_id);
      if (!spvOpcodeIsConstant(stream_opcode)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be constant instruction";
      }
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}